

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

int __thiscall rcg::Device::open(Device *this,char *__file,int __oflag,...)

{
  PIFOpenDevice p_Var1;
  GC_ERROR __val;
  int iVar2;
  void *pvVar3;
  GenTLException *this_00;
  int __oflag_00;
  char *__file_00;
  ulong uVar4;
  DEVICE_ACCESS_FLAGS *pDVar5;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __file_00 = __file;
  std::mutex::lock(&this->mtx);
  iVar2 = this->n_open;
  if (iVar2 == 0) {
    Interface::open((this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,__file_00,__oflag_00);
    uVar4 = 0;
    if ((int)__file != 0) {
      uVar4 = (ulong)((int)__file != 1) + 1;
    }
    pDVar5 = (DEVICE_ACCESS_FLAGS *)(&DAT_00123e8c + uVar4 * 4);
    __val = -0x3eb;
    for (; (iVar2 = (int)__file_00, __val == -0x3eb && (uVar4 < 3)); uVar4 = uVar4 + 1) {
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFOpenDevice;
      pvVar3 = Interface::getHandle
                         ((this->parent).
                          super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      __file_00 = (this->id)._M_dataplus._M_p;
      __val = (*p_Var1)(pvVar3,__file_00,*pDVar5,&this->dev);
      pDVar5 = pDVar5 + 1;
    }
    this->event = (void *)0x0;
    std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->eventadapter).
                super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>);
    if (__val != 0) {
      Interface::close((this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,iVar2);
      this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"Device::open() failed: ",&local_70);
      GenTLException::GenTLException(this_00,&local_50,&this->gentl);
      __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    iVar2 = this->n_open;
  }
  this->n_open = iVar2 + 1;
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar2;
}

Assistant:

void Device::open(ACCESS access)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // convert access mode to GenTL flags

    GenTL::DEVICE_ACCESS_FLAGS mode[]={GenTL::DEVICE_ACCESS_READONLY,
      GenTL::DEVICE_ACCESS_CONTROL, GenTL::DEVICE_ACCESS_EXCLUSIVE};

    int i=0;
    switch (access)
    {
      case READONLY:
        i=0;
        break;

      case CONTROL:
        i=1;
        break;

      default:
      case EXCLUSIVE:
        i=2;
        break;
    }

    // open device (if readonly fails, try control; if control fails try
    // exclusive)

    GenTL::GC_ERROR err = GenTL::GC_ERR_NOT_IMPLEMENTED;
    while (err == GenTL::GC_ERR_NOT_IMPLEMENTED && i < 3)
    {
      err=gentl->IFOpenDevice(parent->getHandle(), id.c_str(), mode[i], &dev);
      i++;
    }

    event=0;
    eventadapter.reset();

    // check if open was successful

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Device::open() failed: "+std::to_string(err), gentl);
    }
  }

  n_open++;
}